

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_data.hpp
# Opt level: O2

bool ex::readDataSet(string *dir_name,
                    vector<std::shared_ptr<wv::AbstractWeightVector>,_std::allocator<std::shared_ptr<wv::AbstractWeightVector>_>_>
                    *points,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *answers,
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
                    *distances)

{
  value_type *__x;
  __shared_ptr<wv::WeightVectorPhrase,_(__gnu_cxx::_Lock_policy)2> *__r;
  uint uVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  istream *piVar5;
  WeightVectorPhrase *this;
  uint uVar6;
  undefined1 local_328 [8];
  ifstream fi;
  uint auStack_308 [122];
  string local_120 [8];
  path targetDir;
  shared_ptr<wv::WeightVectorPhrase> swv;
  __shared_ptr<wv::AbstractWeightVector,(__gnu_cxx::_Lock_policy)2> local_e0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined1 local_d0 [8];
  string line;
  undefined1 local_98 [8];
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> arr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  concr_phrase;
  directory_iterator local_68;
  directory_iterator it;
  directory_iterator eod;
  directory_iterator local_48;
  directory_iterator local_40;
  reference local_38;
  
  line.field_2._8_8_ = answers;
  std::__cxx11::string::string(local_120,(string *)dir_name);
  boost::filesystem::directory_iterator::directory_iterator(&local_68,(path *)local_120,none);
  it.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  local_328 = (undefined1  [8])local_68.m_imp.px;
  if (local_68.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_68.m_imp.px = *(int *)local_68.m_imp.px + 1;
    UNLOCK();
    if (local_68.m_imp.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)local_68.m_imp.px = *(int *)local_68.m_imp.px + 1;
      UNLOCK();
    }
  }
  _fi = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>::~pair
            ((pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator> *)
             local_328);
  boost::foreach_detail_::
  begin<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
            ((auto_any_t)&local_40,
             (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
              *)&eod,(true_ *)0x0);
  boost::foreach_detail_::
  end<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
            ((auto_any_t)&local_48,
             (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
              *)&eod,(true_ *)0x0);
  bVar2 = true;
  do {
    if ((!bVar2) ||
       (bVar2 = boost::filesystem::directory_iterator::equal(&local_40,&local_48), bVar2)) {
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_48.m_imp);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_40.m_imp);
      bVar2 = true;
LAB_00111a1f:
      std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>::~pair
                ((pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>
                  *)&eod);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&it.m_imp);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_68.m_imp);
      std::__cxx11::string::~string(local_120);
      return bVar2;
    }
    local_38 = boost::filesystem::directory_iterator::dereference(&local_40);
    bVar2 = false;
    while (!bVar2) {
      bVar3 = boost::filesystem::is_regular_file((path *)local_38);
      bVar2 = true;
      if (bVar3) {
        boost::filesystem::path::extension();
        bVar3 = boost::filesystem::operator==((path *)local_328,"swp");
        std::__cxx11::string::~string((string *)local_328);
        if (!bVar3) {
          std::ifstream::ifstream((string *)local_328,(string *)local_38,_S_in);
          uVar1 = *(uint *)((long)auStack_308 + *(long *)((long)local_328 + -0x18));
          if ((uVar1 & 5) == 0) {
            local_d0 = (undefined1  [8])&line._M_string_length;
            line._M_dataplus._M_p = (pointer)0x0;
            line._M_string_length._0_1_ = 0;
            arr.m_Size = 0;
            arr._12_4_ = 0;
            while ((piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                       ((istream *)local_328,(string *)local_d0),
                   ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0 &&
                   (line._M_dataplus._M_p != (pointer)0x0))) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&arr.m_Size,(value_type *)local_d0);
            }
            cont::
            StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::StaticArray((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_98,(uint32_t)((ulong)-arr._8_8_ >> 5));
            for (uVar6 = 0; (ulong)uVar6 < (ulong)((long)-arr._8_8_ >> 5); uVar6 = uVar6 + 1) {
              std::__cxx11::string::_M_assign((string *)((long)local_98 + (ulong)uVar6 * 0x20));
            }
            __x = (value_type *)(targetDir.m_pathname.field_2._M_local_buf + 8);
            boost::filesystem::path::filename();
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)line.field_2._8_8_,__x);
            std::__cxx11::string::~string((string *)__x);
            this = (WeightVectorPhrase *)operator_new(0x20);
            wv::WeightVectorPhrase::WeightVectorPhrase
                      (this,(StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_98,distances);
            __r = (__shared_ptr<wv::WeightVectorPhrase,_(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&targetDir.m_pathname.field_2 + 8);
            std::__shared_ptr<wv::WeightVectorPhrase,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<wv::WeightVectorPhrase,void>
                      ((__shared_ptr<wv::WeightVectorPhrase,(__gnu_cxx::_Lock_policy)2> *)__r,this);
            std::__shared_ptr<wv::AbstractWeightVector,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<wv::WeightVectorPhrase,void>(local_e0,__r);
            std::
            vector<std::shared_ptr<wv::AbstractWeightVector>,std::allocator<std::shared_ptr<wv::AbstractWeightVector>>>
            ::emplace_back<std::shared_ptr<wv::AbstractWeightVector>>
                      ((vector<std::shared_ptr<wv::AbstractWeightVector>,std::allocator<std::shared_ptr<wv::AbstractWeightVector>>>
                        *)points,(shared_ptr<wv::AbstractWeightVector> *)local_e0);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&swv);
            cont::
            StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~StaticArray((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_98);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&arr.m_Size);
            std::__cxx11::string::~string((string *)local_d0);
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cerr,"File ");
            poVar4 = std::operator<<(poVar4,(string *)local_38);
            poVar4 = std::operator<<(poVar4,"doesn\'t exist");
            std::endl<char,std::char_traits<char>>(poVar4);
          }
          std::ifstream::~ifstream((string *)local_328);
          if ((uVar1 & 5) != 0) {
            boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                      (&local_48.m_imp);
            boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                      (&local_40.m_imp);
            bVar2 = false;
            goto LAB_00111a1f;
          }
        }
      }
    }
    boost::filesystem::directory_iterator::increment(&local_40);
  } while( true );
}

Assistant:

bool readDataSet(const std::string& dir_name, std::vector<std::shared_ptr<wv::Point>>& points, std::vector<std::string>& answers, const std::unordered_map<std::string, std::unordered_map<std::string, double>>& distances)
    {
        fs::path targetDir(dir_name); 
        fs::directory_iterator it(targetDir), eod;

        BOOST_FOREACH(const fs::path &p, std::make_pair(it, eod))   
        { 
            if(is_regular_file(p))
            {
                if (p.extension() == "swp")
                    continue;
                std::ifstream fi(p.string());
                if (not fi)
                {
                    std::cerr << "File " << p.string() << "doesn't exist" << std::endl;
                    return false;
                }

                std::string line;
                std::vector<std::string> concr_phrase;
                while (std::getline(fi, line) and !line.empty())
                {
                    concr_phrase.push_back(line);
                }
                
                cont::StaticArray<std::string> arr(concr_phrase.size());
                for (uint32_t i = 0; i < concr_phrase.size(); i++)
                    arr[i] = concr_phrase[i];
                    
                answers.push_back(p.filename().string());
                std::shared_ptr<wv::WeightVectorPhrase> swv(new wv::WeightVectorPhrase(arr, distances));
                points.push_back(swv);
            } 
        }
        return true;
    }